

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::
initialize<std::__cxx11::string(*&)(Animal*),std::__cxx11::string,Animal*,pybind11::name,pybind11::scope,pybind11::sibling>
          (cpp_function *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Animal_ptr **f,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Animal_ptr
          *param_2,name *extra,scope *extra_1,sibling *extra_2)

{
  function_record *rec;
  descr<14UL,_1UL> signature;
  
  rec = make_function_record(this);
  rec->data[0] = *f;
  rec->impl = initialize<std::__cxx11::string(*&)(Animal*),std::__cxx11::string,Animal*,pybind11::name,pybind11::scope,pybind11::sibling>(std::__cxx11::string(*&)(Animal*),std::__cxx11::string(*)(Animal*),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
              ::
              {lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}
              ::handle_;
  rec->name = extra->value;
  (rec->scope).m_ptr = (extra_1->value).m_ptr;
  (rec->sibling).m_ptr = (extra_2->value).m_ptr;
  signature.m_types[0] = (type_info *)&Animal::typeinfo;
  signature.m_types[1] = (type_info *)0x0;
  builtin_strncpy(signature.m_text,"({%}) -> {str}",0xf);
  signature._15_1_ = 0;
  initialize_generic(this,rec,signature.m_text,signature.m_types,1);
  rec->field_0x59 = rec->field_0x59 | 2;
  rec->data[1] = &(*)(Animal*)::typeinfo;
  return;
}

Assistant:

void initialize(Func &&f, Return (*)(Args...) PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        static_assert(detail::expected_num_args<Extra...>(sizeof...(Args)),
                      "The number of named arguments does not match the function signature");

        struct capture { typename std::remove_reference<Func>::type f; };

        /* Store the function including any extra state it might have (e.g. a lambda capture object) */
        auto rec = make_function_record();

        /* Store the capture object directly in the function record if there is enough space */
        if (sizeof(capture) <= sizeof(rec->data)) {
            /* Without these pragmas, GCC warns that there might not be
               enough space to use the placement new operator. However, the
               'if' statement above ensures that this is the case. */
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wplacement-new"
#endif
            new ((capture *) &rec->data) capture { std::forward<Func>(f) };
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic pop
#endif
            if (!std::is_trivially_destructible<Func>::value)
                rec->free_data = [](detail::function_record *r) { ((capture *) &r->data)->~capture(); };
        } else {
            rec->data[0] = new capture { std::forward<Func>(f) };
            rec->free_data = [](detail::function_record *r) { delete ((capture *) r->data[0]); };
        }

        /* Type casters for the function arguments and return value */
        using cast_in = detail::argument_loader<Args...>;
        using cast_out = detail::make_caster<
            detail::conditional_t<std::is_void<Return>::value, detail::void_type, Return>
        >;

        /* Dispatch code which converts function arguments and performs the actual function call */
        rec->impl = [](detail::function_record *rec, handle args, handle kwargs, handle parent) -> handle {
            cast_in args_converter;

            /* Try to cast the function arguments into the C++ domain */
            if (!args_converter.load_args(args, kwargs))
                return PYBIND11_TRY_NEXT_OVERLOAD;

            /* Invoke call policy pre-call hook */
            detail::process_attributes<Extra...>::precall(args);

            /* Get a pointer to the capture object */
            capture *cap = (capture *) (sizeof(capture) <= sizeof(rec->data)
                                        ? &rec->data : rec->data[0]);

            /* Override policy for rvalues -- always move */
            constexpr auto is_rvalue = !std::is_pointer<Return>::value
                                       && !std::is_lvalue_reference<Return>::value;
            const auto policy = is_rvalue ? return_value_policy::move : rec->policy;

            /* Perform the function call */
            handle result = cast_out::cast(args_converter.template call<Return>(cap->f),
                                           policy, parent);

            /* Invoke call policy post-call hook */
            detail::process_attributes<Extra...>::postcall(args, result);

            return result;
        };

        /* Process any user-provided function attributes */
        detail::process_attributes<Extra...>::init(extra..., rec);

        /* Generate a readable signature describing the function's arguments and return value types */
        using detail::descr; using detail::_;
        PYBIND11_DESCR signature = _("(") + cast_in::arg_names() + _(") -> ") + cast_out::name();

        /* Register the function with Python from generic (non-templated) code */
        initialize_generic(rec, signature.text(), signature.types(), sizeof...(Args));

        if (cast_in::has_args) rec->has_args = true;
        if (cast_in::has_kwargs) rec->has_kwargs = true;

        /* Stash some additional information used by an important optimization in 'functional.h' */
        using FunctionType = Return (*)(Args...) PYBIND11_NOEXCEPT_SPECIFIER;
        constexpr bool is_function_ptr =
            std::is_convertible<Func, FunctionType>::value &&
            sizeof(capture) == sizeof(void *);
        if (is_function_ptr) {
            rec->is_stateless = true;
            rec->data[1] = (void *) &typeid(FunctionType);
        }
    }